

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_value.hpp
# Opt level: O0

Boxed_Value __thiscall chaiscript::Boxed_Value::assign(Boxed_Value *this,Boxed_Value *rhs)

{
  element_type *rhs_00;
  element_type *this_00;
  __shared_ptr_access<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Boxed_Value BVar1;
  Boxed_Value *rhs_local;
  Boxed_Value *this_local;
  
  rhs_00 = std::
           __shared_ptr_access<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*(in_RDX);
  this_00 = std::
            __shared_ptr_access<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator*((__shared_ptr_access<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)rhs);
  Data::operator=(this_00,rhs_00);
  Boxed_Value(this,rhs);
  BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value assign(const Boxed_Value &rhs) noexcept {
      (*m_data) = (*rhs.m_data);
      return *this;
    }